

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# absVta.c
# Opt level: O3

Vec_Ptr_t * Gia_VtaAbsToFrames(Vec_Int_t *vAbs)

{
  uint uVar1;
  Vec_Ptr_t *pVVar2;
  void **ppvVar3;
  Vec_Int_t *p;
  int *piVar4;
  ulong uVar5;
  ulong uVar6;
  uint uVar7;
  int iVar8;
  uint uVar9;
  ulong uVar10;
  ulong uVar11;
  uint uVar12;
  
  uVar7 = vAbs->nSize;
  if (0 < (int)uVar7) {
    uVar1 = *vAbs->pArray;
    if ((-2 < (long)(int)uVar1) && (uVar1 + 1 < uVar7)) {
      if (vAbs->pArray[uVar1 + 1] != uVar7) {
        __assert_fail("Vec_IntEntry(vAbs, nFrames+1) == Vec_IntSize(vAbs)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/proof/abs/absVta.c"
                      ,0x9a,"Vec_Ptr_t *Gia_VtaAbsToFrames(Vec_Int_t *)");
      }
      pVVar2 = (Vec_Ptr_t *)malloc(0x10);
      uVar10 = 8;
      if (6 < uVar1 - 1) {
        uVar10 = (ulong)uVar1;
      }
      pVVar2->nSize = 0;
      iVar8 = (int)uVar10;
      pVVar2->nCap = iVar8;
      if (iVar8 == 0) {
        ppvVar3 = (void **)0x0;
      }
      else {
        ppvVar3 = (void **)malloc((long)iVar8 << 3);
      }
      pVVar2->pArray = ppvVar3;
      if ((int)uVar1 < 1) {
        uVar12 = 0xffffffff;
      }
      else {
        uVar5 = 0;
        do {
          uVar6 = uVar5 + 1;
          if (((long)vAbs->nSize <= (long)uVar6) || ((ulong)(uint)vAbs->nSize <= uVar5 + 2))
          goto LAB_00581194;
          uVar7 = vAbs->pArray[uVar6];
          uVar11 = (ulong)uVar7;
          uVar12 = vAbs->pArray[uVar5 + 2];
          p = (Vec_Int_t *)malloc(0x10);
          iVar8 = uVar12 - uVar7;
          if ((uVar12 - uVar7) - 1 < 0xf) {
            iVar8 = 0x10;
          }
          p->nSize = 0;
          p->nCap = iVar8;
          if (iVar8 == 0) {
            piVar4 = (int *)0x0;
          }
          else {
            piVar4 = (int *)malloc((long)iVar8 << 2);
          }
          p->pArray = piVar4;
          uVar9 = uVar7;
          while ((int)uVar9 < (int)uVar12) {
            if (((int)uVar7 < 0) || (vAbs->nSize <= (int)uVar11)) goto LAB_00581194;
            Vec_IntPush(p,vAbs->pArray[uVar11]);
            uVar11 = uVar11 + 1;
            uVar9 = (uint)uVar11;
          }
          iVar8 = (int)uVar10;
          if ((int)uVar5 == iVar8) {
            if (iVar8 < 0x10) {
              if (pVVar2->pArray == (void **)0x0) {
                ppvVar3 = (void **)malloc(0x80);
              }
              else {
                ppvVar3 = (void **)realloc(pVVar2->pArray,0x80);
              }
              pVVar2->pArray = ppvVar3;
              pVVar2->nCap = 0x10;
              uVar10 = 0x10;
            }
            else {
              uVar10 = (ulong)(uint)(iVar8 * 2);
              if (pVVar2->pArray == (void **)0x0) {
                ppvVar3 = (void **)malloc(uVar10 * 8);
              }
              else {
                ppvVar3 = (void **)realloc(pVVar2->pArray,uVar10 * 8);
              }
              pVVar2->pArray = ppvVar3;
              pVVar2->nCap = iVar8 * 2;
            }
          }
          else {
            ppvVar3 = pVVar2->pArray;
          }
          pVVar2->nSize = (int)uVar6;
          ppvVar3[uVar5 & 0xffffffff] = p;
          uVar5 = uVar6;
        } while (uVar6 != (long)(int)uVar1);
        uVar7 = vAbs->nSize;
      }
      if (uVar12 == uVar7) {
        return pVVar2;
      }
      __assert_fail("iStop == Vec_IntSize(vAbs)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/proof/abs/absVta.c"
                    ,0xa5,"Vec_Ptr_t *Gia_VtaAbsToFrames(Vec_Int_t *)");
    }
  }
LAB_00581194:
  __assert_fail("i >= 0 && i < p->nSize",
                "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecInt.h"
                ,0x19e,"int Vec_IntEntry(Vec_Int_t *, int)");
}

Assistant:

Vec_Ptr_t * Gia_VtaAbsToFrames( Vec_Int_t * vAbs )
{
    Vec_Ptr_t * vFrames;
    Vec_Int_t * vFrame;
    int i, k, Entry, iStart, iStop = -1;
    int nFrames = Vec_IntEntry( vAbs, 0 );
    assert( Vec_IntEntry(vAbs, nFrames+1) == Vec_IntSize(vAbs) );
    vFrames = Vec_PtrAlloc( nFrames );
    for ( i = 0; i < nFrames; i++ )
    {
        iStart = Vec_IntEntry( vAbs, i+1 );
        iStop  = Vec_IntEntry( vAbs, i+2 );
        vFrame = Vec_IntAlloc( iStop - iStart );
        Vec_IntForEachEntryStartStop( vAbs, Entry, k, iStart, iStop )
            Vec_IntPush( vFrame, Entry );
        Vec_PtrPush( vFrames, vFrame );
    }
    assert( iStop == Vec_IntSize(vAbs) );
    return vFrames;
}